

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O2

bool __thiscall
TiXmlPrinter::VisitEnter(TiXmlPrinter *this,TiXmlElement *element,TiXmlAttribute *firstAttribute)

{
  TiXmlString *this_00;
  TiXmlNode *pTVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int extraout_EDX;
  TiXmlAttribute *attrib;
  
  DoIndent(this);
  this_00 = &this->buffer;
  TiXmlString::operator+=(this_00,"<");
  TiXmlString::operator+=(this_00,((element->super_TiXmlNode).value.rep_)->str);
  for (; firstAttribute != (TiXmlAttribute *)0x0;
      firstAttribute = TiXmlAttribute::Next(firstAttribute)) {
    TiXmlString::operator+=(this_00," ");
    TiXmlAttribute::Print(firstAttribute,(FILE *)0x0,extraout_EDX,this_00);
  }
  if ((element->super_TiXmlNode).firstChild == (TiXmlNode *)0x0) {
    TiXmlString::operator+=(this_00," />");
  }
  else {
    TiXmlString::operator+=(this_00,">");
    iVar2 = (*(((element->super_TiXmlNode).firstChild)->super_TiXmlBase)._vptr_TiXmlBase[8])();
    if ((CONCAT44(extraout_var,iVar2) != 0) &&
       (pTVar1 = (element->super_TiXmlNode).firstChild,
       (element->super_TiXmlNode).lastChild == pTVar1)) {
      iVar2 = (*(pTVar1->super_TiXmlBase)._vptr_TiXmlBase[8])();
      if (*(char *)(CONCAT44(extraout_var_00,iVar2) + 0x50) == '\0') {
        this->simpleTextPrint = true;
        goto LAB_0010df01;
      }
    }
  }
  DoLineBreak(this);
LAB_0010df01:
  this->depth = this->depth + 1;
  return true;
}

Assistant:

bool TiXmlPrinter::VisitEnter( const TiXmlElement& element, const TiXmlAttribute* firstAttribute )
{
	DoIndent();
	buffer += "<";
	buffer += element.Value();

	for( const TiXmlAttribute* attrib = firstAttribute; attrib; attrib = attrib->Next() )
	{
		buffer += " ";
		attrib->Print( 0, 0, &buffer );
	}

	if ( !element.FirstChild() ) 
	{
		buffer += " />";
		DoLineBreak();
	}
	else 
	{
		buffer += ">";
		if (    element.FirstChild()->ToText()
			  && element.LastChild() == element.FirstChild()
			  && element.FirstChild()->ToText()->CDATA() == false )
		{
			simpleTextPrint = true;
			// no DoLineBreak()!
		}
		else
		{
			DoLineBreak();
		}
	}
	++depth;	
	return true;
}